

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall
trackerboy::apu::Mixer::mixfast<(trackerboy::apu::MixMode)1>
          (Mixer *this,int8_t delta,uint32_t cycletime)

{
  float s1;
  float s0;
  size_t i;
  float *nextset;
  pair<float,_float> local_40;
  pair<float,_float> deltaRight;
  pair<float,_float> deltaLeft;
  MixParam param;
  uint32_t cycletime_local;
  int8_t delta_local;
  Mixer *this_local;
  
  getMixParameters((MixParam *)&deltaLeft,this,cycletime);
  param.stepset = param.stepset + 1;
  std::pair<float,_float>::pair<float,_float,_true>(&deltaRight);
  std::pair<float,_float>::pair<float,_float,_true>(&local_40);
  nextset = (float *)deltaScale((float)(int)delta,this->mVolumeStepRight,param.dest._0_4_);
  std::pair<float,_float>::operator=(&local_40,(type)&nextset);
  _s1 = 0x10;
  i = (long)deltaLeft + 0x40;
  while (_s1 != 0) {
    *param.stepset =
         local_40.first * *(float *)deltaLeft + local_40.second * *(float *)i + *param.stepset;
    param.stepset = param.stepset + 2;
    _s1 = _s1 + -1;
    i = i + 4;
    deltaLeft = (pair<float,_float>)((long)deltaLeft + 4);
  }
  return;
}

Assistant:

void Mixer::mixfast(int8_t delta, uint32_t cycletime) {
    // muted mixing is a no-op, so don't bother instantiating a template
    // for this mode.
    static_assert(mode != MixMode::mute, "cannot mix a muted mode!");

    auto param = getMixParameters(cycletime);

    if constexpr (mode == MixMode::right) {
        ++param.dest;
    }

    std::pair<float, float> deltaLeft, deltaRight;

    if constexpr (modePansLeft(mode)) {
        deltaLeft = deltaScale(delta, mVolumeStepLeft, param.timeFract);
    }

    if constexpr (modePansRight(mode)) {
        deltaRight = deltaScale(delta, mVolumeStepRight, param.timeFract);
    }

    // interpolate with the next step set
    auto nextset = param.stepset + TU::STEP_WIDTH;
    for (auto i = TU::STEP_WIDTH; i--; ) {
        auto const s0 = *param.stepset++;
        auto const s1 = *nextset++;


        if constexpr (modePansLeft(mode)) {
            *param.dest++ += deltaLeft.first * s0 + deltaLeft.second * s1;
        }

        if constexpr (modePansRight(mode)) {
            *param.dest++ += deltaRight.first * s0 + deltaRight.second * s1;
        }

        if constexpr (mode != MixMode::middle) {
            ++param.dest;
        }
    }

}